

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

bool tinyexr::ReadAttribute
               (string *name,string *type,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *data,size_t *marker_size,
               char *marker,size_t size)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  pointer __dest;
  bool bVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  size_t *psVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  uint *puVar8;
  undefined8 uVar9;
  ulong uVar10;
  char *pcVar11;
  pointer __new_size;
  char *pcVar12;
  ulong *puVar13;
  char *this_00;
  size_t __maxlen;
  ulong uVar14;
  value_type vStack_f0;
  undefined1 *apuStack_b8 [2];
  undefined1 auStack_a8 [16];
  pointer pcStack_98;
  uint *puStack_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_88;
  size_t *psStack_80;
  size_t sStack_78;
  code *pcStack_70;
  string *local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_60;
  size_t *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pcStack_70 = (code *)0x21d0f1;
  local_68 = type;
  sVar6 = strnlen(marker,size);
  if (sVar6 != size) {
    pcStack_70 = (code *)0x21d124;
    local_60 = data;
    local_58 = marker_size;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,marker,marker + sVar6);
    pcStack_70 = (code *)0x21d12f;
    std::__cxx11::string::operator=((string *)name,(string *)local_50);
    if (local_50[0] != local_40) {
      pcStack_70 = (code *)0x21d13c;
      operator_delete(local_50[0]);
    }
    pcVar11 = marker + sVar6 + 1;
    __maxlen = size - (sVar6 + 1);
    pcStack_70 = (code *)0x21d154;
    sVar7 = strnlen(pcVar11,__maxlen);
    if (sVar7 != __maxlen) {
      pcStack_70 = (code *)0x21d177;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar11,pcVar11 + sVar7);
      pcStack_70 = (code *)0x21d183;
      std::__cxx11::string::operator=((string *)local_68,(string *)local_50);
      if (local_50[0] != local_40) {
        pcStack_70 = (code *)0x21d190;
        operator_delete(local_50[0]);
      }
      psVar4 = local_58;
      this = local_60;
      uVar14 = __maxlen - (sVar7 + 1);
      if (3 < uVar14) {
        puVar8 = (uint *)(pcVar11 + sVar7 + 1);
        __new_size = (pointer)(ulong)*puVar8;
        if (__new_size == (pointer)0x0) {
          pcStack_70 = (code *)0x21d205;
          iVar5 = std::__cxx11::string::compare((char *)local_68);
          if (iVar5 == 0) {
            *psVar4 = sVar6 + sVar7 + 6;
            pcStack_70 = (code *)0x21d232;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this,1);
            *(this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start = '\0';
            return true;
          }
        }
        else if (__new_size <= (pointer)(uVar14 - 4)) {
          pcStack_70 = (code *)0x21d1cc;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (local_60,(size_type)__new_size);
          __dest = (this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          if ((this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish != __dest) {
            pcStack_70 = (code *)0x21d1e5;
            memcpy(__dest,pcVar11 + sVar7 + 5,(size_t)__new_size);
            *psVar4 = (size_t)(__new_size + sVar6 + sVar7 + 6);
            return true;
          }
          this_00 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
          puVar13 = (ulong *)0x0;
          pcStack_70 = ReadChannelInfo;
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
          psStack_80 = psVar4;
          pvStack_88 = this;
          pcVar11 = (char *)*puVar13;
          pcStack_98 = __new_size;
          puStack_90 = puVar8;
          sStack_78 = sVar6;
          pcStack_70 = (code *)sVar7;
          if ((char *)puVar13[1] == pcVar11) {
            uVar9 = std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,0,0);
            if (vStack_f0.name._M_dataplus._M_p != __new_size) {
              operator_delete(vStack_f0.name._M_dataplus._M_p);
            }
            _Unwind_Resume(uVar9);
          }
          paVar1 = &vStack_f0.name.field_2;
          do {
            cVar2 = *pcVar11;
            if (cVar2 == '\0') break;
            vStack_f0.name._M_string_length = 0;
            vStack_f0.name.field_2._M_local_buf[0] = '\0';
            vStack_f0.requested_pixel_type = 0;
            uVar14 = (long)puVar13[1] - (long)pcVar11;
            vStack_f0.name._M_dataplus._M_p = (pointer)paVar1;
            if ((long)uVar14 < 0) {
              bVar3 = false;
            }
            else {
              if ((char *)puVar13[1] != pcVar11) {
                uVar10 = 0;
                pcVar12 = pcVar11;
                do {
                  if (*pcVar12 == '\0') {
                    apuStack_b8[0] = auStack_a8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)apuStack_b8,pcVar11,pcVar12);
                    std::__cxx11::string::operator=((string *)&vStack_f0,(string *)apuStack_b8);
                    if (apuStack_b8[0] != auStack_a8) {
                      operator_delete(apuStack_b8[0]);
                    }
                    pcVar11 = pcVar12 + 0x11;
                    if ((char *)puVar13[1] <= pcVar11) {
                      pcVar11 = pcVar12 + 1;
                      goto LAB_0021d2dd;
                    }
                    vStack_f0.pixel_type = *(int *)(pcVar12 + 1);
                    vStack_f0.p_linear = pcVar12[5];
                    vStack_f0.x_sampling = *(int *)(pcVar12 + 9);
                    vStack_f0.y_sampling = *(int *)(pcVar12 + 0xd);
                    bVar3 = true;
                    std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::
                    push_back((vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                               *)this_00,&vStack_f0);
                    goto LAB_0021d35a;
                  }
                  pcVar12 = pcVar12 + 1;
                  uVar10 = uVar10 + 1;
                } while (uVar10 < uVar14);
              }
              vStack_f0.name.field_2._M_local_buf[0] = '\0';
              pcVar11 = (char *)0x0;
LAB_0021d2dd:
              bVar3 = false;
            }
LAB_0021d35a:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vStack_f0.name._M_dataplus._M_p != paVar1) {
              operator_delete(vStack_f0.name._M_dataplus._M_p);
            }
          } while (bVar3);
          return cVar2 == '\0';
        }
      }
    }
  }
  return false;
}

Assistant:

static bool ReadAttribute(std::string *name, std::string *type,
                          std::vector<unsigned char> *data, size_t *marker_size,
                          const char *marker, size_t size) {
  size_t name_len = strnlen(marker, size);
  if (name_len == size) {
    // String does not have a terminating character.
    return false;
  }
  *name = std::string(marker, name_len);

  marker += name_len + 1;
  size -= name_len + 1;

  size_t type_len = strnlen(marker, size);
  if (type_len == size) {
    return false;
  }
  *type = std::string(marker, type_len);

  marker += type_len + 1;
  size -= type_len + 1;

  if (size < sizeof(uint32_t)) {
    return false;
  }

  uint32_t data_len;
  memcpy(&data_len, marker, sizeof(uint32_t));
  tinyexr::swap4(reinterpret_cast<unsigned int *>(&data_len));

  if (data_len == 0) {
    if ((*type).compare("string") == 0) {
      // Accept empty string attribute.

      marker += sizeof(uint32_t);
      size -= sizeof(uint32_t);

      *marker_size = name_len + 1 + type_len + 1 + sizeof(uint32_t);

      data->resize(1);
      (*data)[0] = '\0';

      return true;
    } else {
      return false;
    }
  }

  marker += sizeof(uint32_t);
  size -= sizeof(uint32_t);

  if (size < data_len) {
    return false;
  }

  data->resize(static_cast<size_t>(data_len));
  memcpy(&data->at(0), marker, static_cast<size_t>(data_len));

  *marker_size = name_len + 1 + type_len + 1 + sizeof(uint32_t) + data_len;
  return true;
}